

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall google::protobuf::TextFormat::Printer::TextGenerator::Outdent(TextGenerator *this)

{
  LogMessage *this_00;
  long in_RDI;
  LogMessage *other;
  LogMessage *in_stack_ffffffffffffffa0;
  LogMessage *in_stack_ffffffffffffffb0;
  LogMessage local_40;
  
  if ((*(int *)(in_RDI + 0x20) == 0) || (*(int *)(in_RDI + 0x20) < *(int *)(in_RDI + 0x24))) {
    other = &local_40;
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffffb0,(LogLevel)((ulong)in_RDI >> 0x20),
               (char *)in_stack_ffffffffffffffa0,(int)((ulong)other >> 0x20));
    this_00 = internal::LogMessage::operator<<(in_stack_ffffffffffffffa0,(char *)other);
    internal::LogFinisher::operator=((LogFinisher *)this_00,other);
    internal::LogMessage::~LogMessage((LogMessage *)0x718797);
  }
  else {
    *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) + -1;
  }
  return;
}

Assistant:

void Outdent() override {
    if (indent_level_ == 0 || indent_level_ < initial_indent_level_) {
      GOOGLE_LOG(DFATAL) << " Outdent() without matching Indent().";
      return;
    }

    --indent_level_;
  }